

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

TCGv_vec tcg_temp_new_vec_aarch64(TCGContext_conflict1 *tcg_ctx,TCGType type)

{
  TCGTemp *t_00;
  TCGv_vec pTVar1;
  TCGTemp *t;
  TCGType type_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  t_00 = tcg_temp_new_internal_aarch64(tcg_ctx,type,false);
  pTVar1 = temp_tcgv_vec(tcg_ctx,t_00);
  return pTVar1;
}

Assistant:

TCGv_vec tcg_temp_new_vec(TCGContext *tcg_ctx, TCGType type)
{
    TCGTemp *t;

#ifdef CONFIG_DEBUG_TCG
    switch (type) {
    case TCG_TYPE_V64:
        assert(TCG_TARGET_HAS_v64);
        break;
    case TCG_TYPE_V128:
        assert(TCG_TARGET_HAS_v128);
        break;
    case TCG_TYPE_V256:
        assert(TCG_TARGET_HAS_v256);
        break;
    default:
        g_assert_not_reached();
    }
#endif

    t = tcg_temp_new_internal(tcg_ctx, type, 0);
    return temp_tcgv_vec(tcg_ctx, t);
}